

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

void bgrat(double *a,double *b,double *x,double *y,double *w,double *eps,int *ierr)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  bgrat::bm1 = *b + -0.5 + -0.5;
  bgrat::nu = bgrat::bm1 * 0.5 + *a;
  if (*y <= 0.375) {
    bgrat::T1 = -*y;
    bgrat::lnx = alnrel(&bgrat::T1);
  }
  else {
    bgrat::lnx = log(*x);
  }
  bgrat::z = -bgrat::nu * bgrat::lnx;
  dVar9 = *b;
  dVar10 = bgrat::z * dVar9;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar7 = gam1(b);
    dVar10 = *b;
    dVar8 = log(bgrat::z);
    dVar10 = exp(dVar8 * dVar10);
    bgrat::r = dVar10 * dVar9 * (dVar7 + 1.0);
    dVar9 = exp(*a * bgrat::lnx);
    dVar10 = exp(bgrat::bm1 * 0.5 * bgrat::lnx);
    bgrat::r = dVar10 * dVar9 * bgrat::r;
    dVar7 = algdiv(b,a);
    dVar9 = *b;
    dVar8 = log(bgrat::nu);
    dVar10 = bgrat::r;
    bgrat::u = dVar8 * dVar9 + dVar7;
    dVar9 = exp(-bgrat::u);
    bgrat::u = dVar9 * dVar10;
    if ((bgrat::u != 0.0) || (NAN(bgrat::u))) {
      grat1(b,&bgrat::z,&bgrat::r,&bgrat::p,&bgrat::q,eps);
      dVar1 = bgrat::z;
      dVar8 = bgrat::u;
      dVar7 = bgrat::bm1;
      dVar11 = 1.0 / bgrat::nu;
      dVar12 = bgrat::lnx * 0.25 * bgrat::lnx;
      dVar9 = *w;
      dVar15 = dVar9 / bgrat::u;
      dVar16 = bgrat::q / bgrat::r;
      dVar10 = *b;
      lVar2 = 1;
      pdVar3 = bgrat::c + 0x1d;
      lVar4 = 0;
      dVar20 = 1.0;
      dVar21 = 1.0;
      dVar13 = 0.0;
      dVar19 = dVar16;
      do {
        dVar14 = dVar13 + 2.0;
        dVar21 = dVar21 / ((dVar14 + 1.0) * dVar14);
        (&bgrat::z)[lVar2] = dVar21;
        dVar18 = 0.0;
        if (lVar2 != 1) {
          dVar18 = 0.0;
          lVar6 = 0;
          pdVar5 = pdVar3;
          dVar17 = dVar10 - (double)(int)lVar2;
          do {
            dVar18 = dVar18 + dVar17 * *(double *)((long)bgrat::c + lVar6) * *pdVar5;
            lVar6 = lVar6 + 8;
            pdVar5 = pdVar5 + -1;
            dVar17 = dVar10 + dVar17;
          } while (lVar4 != lVar6);
        }
        dVar13 = dVar13 + dVar10;
        dVar16 = (dVar16 * (dVar13 + 1.0) * dVar13 + (dVar13 + dVar1 + 1.0) * dVar20) *
                 dVar11 * dVar11 * 0.25;
        dVar13 = dVar7 * dVar21 + dVar18 / (double)(int)lVar2;
        bgrat::c[lVar2 + 0x1d] = dVar13;
        dVar13 = dVar13 * dVar16;
        dVar19 = dVar19 + dVar13;
        if (dVar19 <= 0.0) goto LAB_00105079;
        if (ABS(dVar13) <= (dVar15 + dVar19) * *eps) break;
        dVar20 = dVar20 * dVar12;
        lVar2 = lVar2 + 1;
        pdVar3 = pdVar3 + 1;
        lVar4 = lVar4 + 8;
        dVar13 = dVar14;
      } while (lVar2 != 0x1f);
      *ierr = 0;
      *w = dVar8 * dVar19 + dVar9;
      return;
    }
  }
LAB_00105079:
  *ierr = 1;
  return;
}

Assistant:

void bgrat(double *a,double *b,double *x,double *y,double *w,
           double *eps,int *ierr)
/*
-----------------------------------------------------------------------
     ASYMPTOTIC EXPANSION FOR IX(A,B) WHEN A IS LARGER THAN B.
     THE RESULT OF THE EXPANSION IS ADDED TO W. IT IS ASSUMED
     THAT A .GE. 15 AND B .LE. 1.  EPS IS THE TOLERANCE USED.
     IERR IS A VARIABLE THAT REPORTS THE STATUS OF THE RESULTS.
-----------------------------------------------------------------------
*/
{
static double bm1,bp2n,cn,coef,dj,j,l,lnx,n2,nu,p,q,r,s,sum,t,t2,u,v,z;
static int i,n,nm1;
static double c[30],d[30],T1;
/*
     ..
     .. Executable Statements ..
*/
    bm1 = *b-0.5e0-0.5e0;
    nu = *a+0.5e0*bm1;
    if(*y > 0.375e0) goto S10;
    T1 = -*y;
    lnx = alnrel(&T1);
    goto S20;
S10:
    lnx = log(*x);
S20:
    z = -(nu*lnx);
    if(*b*z == 0.0e0) goto S70;
/*
                 COMPUTATION OF THE EXPANSION
                 SET R = EXP(-Z)*Z**B/GAMMA(B)
*/
    r = *b*(1.0e0+gam1(b))*exp(*b*log(z));
    r *= (exp(*a*lnx)*exp(0.5e0*bm1*lnx));
    u = algdiv(b,a)+*b*log(nu);
    u = r*exp(-u);
    if(u == 0.0e0) goto S70;
    grat1(b,&z,&r,&p,&q,eps);
    v = 0.25e0*pow(1.0e0/nu,2.0);
    t2 = 0.25e0*lnx*lnx;
    l = *w/u;
    j = q/r;
    sum = j;
    t = cn = 1.0e0;
    n2 = 0.0e0;
    for(n=1; n<=30; n++) {
        bp2n = *b+n2;
        j = (bp2n*(bp2n+1.0e0)*j+(z+bp2n+1.0e0)*t)*v;
        n2 += 2.0e0;
        t *= t2;
        cn /= (n2*(n2+1.0e0));
        c[n-1] = cn;
        s = 0.0e0;
        if(n == 1) goto S40;
        nm1 = n-1;
        coef = *b-(double)n;
        for(i=1; i<=nm1; i++) {
            s += (coef*c[i-1]*d[n-i-1]);
            coef += *b;
        }
S40:
        d[n-1] = bm1*cn+s/(double)n;
        dj = d[n-1]*j;
        sum += dj;
        if(sum <= 0.0e0) goto S70;
        if(fabs(dj) <= *eps*(sum+l)) goto S60;
    }
S60:
/*
                    ADD THE RESULTS TO W
*/
    *ierr = 0;
    *w += (u*sum);
    return;
S70:
/*
               THE EXPANSION CANNOT BE COMPUTED
*/
    *ierr = 1;
    return;
}